

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplatedCustomNamer.cpp
# Opt level: O2

string * anon_unknown.dwarf_83f55::replaceIfContains
                   (string *__return_storage_ptr__,string *input,string *pattern,
                   function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                   *replacer)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  bVar1 = ApprovalTests::StringUtils::contains((string *)input,(string *)pattern);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_40,(string *)input);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(&local_60,replacer);
    ApprovalTests::StringUtils::replaceAll
              ((string *)__return_storage_ptr__,&local_40,(string *)pattern,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string replaceIfContains(std::string input,
                                  std::string pattern,
                                  std::function<std::string(void)> replacer)
    {
        if (!ApprovalTests::StringUtils::contains(input, pattern))
        {
            return input;
        }
        return ApprovalTests::StringUtils::replaceAll(input, pattern, replacer());
    }